

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int CVmObjBigNum::read_from_data_file(vm_val_t *retval,CVmDataSource *fp)

{
  int iVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  char buf [16];
  ushort local_28 [8];
  
  iVar1 = (*fp->_vptr_CVmDataSource[2])(fp,local_28,2);
  uVar2 = 1;
  if (iVar1 == 0) {
    vVar3 = create(0,(ulong)local_28[0]);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar3;
    iVar1 = (*fp->_vptr_CVmDataSource[2])
                      (fp,*(undefined8 *)
                           ((long)&G_obj_table_X.pages_[vVar3 >> 0xc][vVar3 & 0xfff].ptr_ + 8),
                       (ulong)(local_28[0] + 1 >> 1) + 5);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

int CVmObjBigNum::read_from_data_file(VMG_ vm_val_t *retval, CVmDataSource *fp)
{
    char buf[16];
    size_t prec;
    CVmObjBigNum *bignum;

    /* read the precision */
    if (fp->read(buf, 2))
        return 1;
    prec = osrp2(buf);

    /* create a BigNumber with the required precision */
    retval->set_obj(create(vmg_ FALSE, prec));
    bignum = (CVmObjBigNum *)vm_objp(vmg_ retval->val.obj);

    /* read the bytes into the new object's extension */
    if (fp->read(bignum->get_ext(), calc_alloc(prec)))
        return 1;

    /* success */
    return 0;
}